

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O0

void ncnn::conv3x3s1_winograd43_transform_kernel_tile
               (Mat *kernel,Mat *A,int inch,int i,int max_ii,int k,int max_kk)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  float ktm4;
  float ktm3;
  float ktm2;
  float ktm1;
  float ktm0;
  float sq2;
  int kk;
  int ii;
  float *ptmp;
  int local_c4;
  int local_b4;
  float *local_b0;
  float local_a8 [10];
  float z5;
  float z4;
  float z3;
  float z2;
  float z1;
  float z0;
  float r2_1;
  float r1_1;
  float r0_1;
  int m_1;
  float r2;
  float r1;
  float r0;
  int m;
  float *k0;
  int local_40;
  int local_3c;
  float *local_38;
  
  local_38 = (float *)*in_RSI;
  for (local_3c = 0; local_3c < in_R8D; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < in_stack_00000008; local_40 = local_40 + 1) {
      local_b0 = (float *)(*in_RDI + (long)((in_ECX + local_3c) * in_EDX * 9) * 4 +
                          (long)((in_R9D + local_40) * 9) * 4);
      for (local_b4 = 0; local_b4 < 3; local_b4 = local_b4 + 1) {
        fVar1 = *local_b0;
        fVar2 = local_b0[1];
        fVar3 = local_b0[2];
        local_a8[local_b4] = fVar1;
        local_a8[(long)local_b4 + 3] =
             (-fVar1 * 0.6666667 - fVar2 * 0.47140452) - fVar3 * 0.33333334;
        local_a8[(long)local_b4 + 6] =
             (-fVar1 * 0.6666667 + fVar2 * 0.47140452) - fVar3 * 0.33333334;
        local_a8[(long)local_b4 + 9] = fVar1 * 0.16666667 + fVar2 * 0.23570226 + fVar3 * 0.33333334;
        (&z3)[local_b4] = (fVar1 * 0.16666667 - fVar2 * 0.23570226) + fVar3 * 0.33333334;
        (&z0)[local_b4] = fVar3;
        local_b0 = local_b0 + 3;
      }
      for (local_c4 = 0; local_c4 < 6; local_c4 = local_c4 + 1) {
        fVar1 = local_a8[(long)local_c4 * 3];
        fVar2 = local_a8[(long)local_c4 * 3 + 1];
        fVar3 = local_a8[(long)local_c4 * 3 + 2];
        *local_38 = fVar1;
        local_38[1] = (-fVar1 * 0.6666667 - fVar2 * 0.47140452) - fVar3 * 0.33333334;
        local_38[2] = (-fVar1 * 0.6666667 + fVar2 * 0.47140452) - fVar3 * 0.33333334;
        local_38[3] = fVar1 * 0.16666667 + fVar2 * 0.23570226 + fVar3 * 0.33333334;
        local_38[4] = (fVar1 * 0.16666667 - fVar2 * 0.23570226) + fVar3 * 0.33333334;
        local_38[5] = fVar3;
        local_38 = local_38 + 6;
      }
    }
  }
  return;
}

Assistant:

static inline void conv3x3s1_winograd43_transform_kernel_tile(const Mat& kernel, Mat& A, int inch, int i, int max_ii, int k, int max_kk)
{
    float* ptmp = A;

    int ii = 0;
    for (; ii < max_ii; ii++)
    {
        int kk = 0;
        for (; kk < max_kk; kk++)
        {
            const float sq2 = 1.41421356237f;
            // const float ktm[6][3] = {
            //     {1.0f, 0.0f, 0.0f},
            //     {-2.0f / 3, -sq2 / 3, -1.0f / 3},
            //     {-2.0f / 3, sq2 / 3, -1.0f / 3},
            //     {1.0f / 6, sq2 / 6, 1.0f / 3},
            //     {1.0f / 6, -sq2 / 6, 1.0f / 3},
            //     {0.0f, 0.0f, 1.0f}
            // };
            const float ktm0 = 2.0f / 3;
            const float ktm1 = sq2 / 3;
            const float ktm2 = 1.0f / 3;
            const float ktm3 = 1.0f / 6;
            const float ktm4 = sq2 / 6;

            float tmp[6][3];

            const float* k0 = (const float*)kernel + (i + ii) * inch * 9 + (k + kk) * 9;

            for (int m = 0; m < 3; m++)
            {
                float r0 = k0[0];
                float r1 = k0[1];
                float r2 = k0[2];

                tmp[0][m] = r0;
                tmp[1][m] = -r0 * ktm0 - r1 * ktm1 - r2 * ktm2;
                tmp[2][m] = -r0 * ktm0 + r1 * ktm1 - r2 * ktm2;
                tmp[3][m] = r0 * ktm3 + r1 * ktm4 + r2 * ktm2;
                tmp[4][m] = r0 * ktm3 - r1 * ktm4 + r2 * ktm2;
                tmp[5][m] = r2;

                k0 += 3;
            }

            for (int m = 0; m < 6; m++)
            {
                float r0 = tmp[m][0];
                float r1 = tmp[m][1];
                float r2 = tmp[m][2];

                float z0 = r0;
                float z1 = -r0 * ktm0 - r1 * ktm1 - r2 * ktm2;
                float z2 = -r0 * ktm0 + r1 * ktm1 - r2 * ktm2;
                float z3 = r0 * ktm3 + r1 * ktm4 + r2 * ktm2;
                float z4 = r0 * ktm3 - r1 * ktm4 + r2 * ktm2;
                float z5 = r2;

                ptmp[0] = z0;
                ptmp[1] = z1;
                ptmp[2] = z2;
                ptmp[3] = z3;
                ptmp[4] = z4;
                ptmp[5] = z5;
                ptmp += 6;
            }
        }
    }
}